

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_from_string__zeros(void)

{
  _Bool _Var1;
  undefined1 local_48 [8];
  bson_decimal128_t negative_zero;
  bson_decimal128_t large_exponent;
  bson_decimal128_t exponent_zero;
  bson_decimal128_t zero;
  
  bson_decimal128_from_string("0",&exponent_zero.high);
  bson_decimal128_from_string("0e-611",&large_exponent.high);
  bson_decimal128_from_string("0e+6000",&negative_zero.high);
  bson_decimal128_from_string("-0e-1",local_48);
  _Var1 = decimal128_equal((bson_decimal128_t *)&exponent_zero.high,0x3040000000000000,0);
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x217,"test_decimal128_from_string__zeros",
            "decimal128_equal (&zero, 0x3040000000000000, 0x0000000000000000)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)&large_exponent.high,0x2b7a000000000000,0);
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x219,"test_decimal128_from_string__zeros",
            "decimal128_equal ( &exponent_zero, 0x2b7a000000000000, 0x0000000000000000)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)&negative_zero.high,0x5f20000000000000,0);
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x21b,"test_decimal128_from_string__zeros",
            "decimal128_equal ( &large_exponent, 0x5f20000000000000, 0x0000000000000000)");
    abort();
  }
  _Var1 = decimal128_equal((bson_decimal128_t *)local_48,0xb03e000000000000,0);
  if (!_Var1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x21d,"test_decimal128_from_string__zeros",
            "decimal128_equal ( &negative_zero, 0xb03e000000000000, 0x0000000000000000)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_from_string__zeros (void)
{
   bson_decimal128_t zero;
   bson_decimal128_t exponent_zero;
   bson_decimal128_t large_exponent;
   bson_decimal128_t negative_zero;

   bson_decimal128_from_string ("0", &zero);
   bson_decimal128_from_string ("0e-611", &exponent_zero);
   bson_decimal128_from_string ("0e+6000", &large_exponent);
   bson_decimal128_from_string ("-0e-1", &negative_zero);

   BSON_ASSERT (decimal128_equal (&zero, 0x3040000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &exponent_zero, 0x2b7a000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &large_exponent, 0x5f20000000000000, 0x0000000000000000));
   BSON_ASSERT (decimal128_equal (
      &negative_zero, 0xb03e000000000000, 0x0000000000000000));
}